

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::H2V1ConvertFiltered(jpeg_decoder *this)

{
  byte bVar1;
  uint8 *puVar2;
  uint8 *puVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  char *__assertion;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  
  if (0 < this->m_image_x_size) {
    uVar4 = (this->m_image_x_size >> 1) - 1;
    iVar6 = (this->m_max_mcu_y_size - this->m_mcu_lines_left) * 8;
    puVar2 = this->m_pScan_line_0;
    uVar10 = 0;
    uVar11 = 0;
    uVar13 = 0;
    do {
      uVar12 = (uint)uVar13;
      uVar7 = (uVar12 & 7 | uVar10 & 0x40 | uVar11 & 0xffffff00) + iVar6;
      if ((int)uVar7 < 0) {
LAB_00150a60:
        __assertion = "ofs >= 0";
LAB_00150a67:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.h"
                      ,0x116,"int jpgd::jpeg_decoder::check_sample_buf_ofs(int) const");
      }
      uVar19 = this->m_max_blocks_per_row * 0x40;
      if ((int)uVar19 <= (int)uVar7) {
LAB_00150a57:
        __assertion = "ofs < m_max_blocks_per_row * 64";
        goto LAB_00150a67;
      }
      uVar14 = (int)(uVar12 - 1) >> 1;
      uVar20 = uVar14 + 1;
      if ((int)uVar4 <= (int)(uVar14 + 1)) {
        uVar20 = uVar4;
      }
      if ((int)uVar14 < 1) {
        uVar14 = 0;
      }
      iVar15 = (uVar14 & 7 | (uVar14 & 0xfffffff8) << 5) + iVar6;
      uVar14 = iVar15 + 0x80;
      if ((int)uVar14 < 0) goto LAB_00150a60;
      if (uVar19 <= uVar14) goto LAB_00150a57;
      uVar16 = iVar15 + 0xc0;
      if ((int)uVar16 < 0) goto LAB_00150a60;
      if (uVar19 <= uVar16) goto LAB_00150a57;
      iVar15 = (uVar20 & 7 | (uVar20 & 0xfffffff8) << 5) + iVar6;
      uVar20 = iVar15 + 0x80;
      if ((int)uVar20 < 0) goto LAB_00150a60;
      if (uVar19 <= uVar20) goto LAB_00150a57;
      uVar17 = iVar15 + 0xc0;
      if ((int)uVar17 < 0) goto LAB_00150a60;
      if (uVar19 <= uVar17) goto LAB_00150a57;
      puVar3 = this->m_pSample_buf;
      bVar1 = puVar3[uVar7];
      iVar15 = (uVar12 & 1) * 2 + 1;
      iVar8 = (uint)((uVar13 & 1) == 0) * 2 + 1;
      uVar5 = (ulong)((uint)puVar3[uVar16] * iVar15 + (uint)puVar3[uVar17] * iVar8 + 2 & 0xffc);
      iVar18 = *(int *)((long)this->m_crr + uVar5) + (uint)bVar1;
      if (iVar18 < 1) {
        iVar18 = 0;
      }
      if (0xfe < iVar18) {
        iVar18 = 0xff;
      }
      uVar9 = (ulong)(iVar8 * (uint)puVar3[uVar20] + iVar15 * (uint)puVar3[uVar14] + 2 & 0xffc);
      iVar8 = (*(int *)((long)this->m_cbg + uVar9) + *(int *)((long)this->m_crg + uVar5) >> 0x10) +
              (uint)bVar1;
      iVar15 = (uint)bVar1 + *(int *)((long)this->m_cbb + uVar9);
      puVar2[uVar13 * 4] = (uint8)iVar18;
      if (iVar8 < 1) {
        iVar8 = 0;
      }
      if (0xfe < iVar8) {
        iVar8 = 0xff;
      }
      puVar2[uVar13 * 4 + 1] = (uint8)iVar8;
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      if (0xfe < iVar15) {
        iVar15 = 0xff;
      }
      puVar2[uVar13 * 4 + 2] = (uint8)iVar15;
      puVar2[uVar13 * 4 + 3] = 0xff;
      uVar13 = uVar13 + 1;
      uVar11 = uVar11 + 0x10;
      uVar10 = uVar10 + 8;
    } while ((int)uVar13 < this->m_image_x_size);
  }
  return;
}

Assistant:

void jpeg_decoder::H2V1ConvertFiltered()
	{
		const uint BLOCKS_PER_MCU = 4;
		int row = m_max_mcu_y_size - m_mcu_lines_left;
		uint8* d0 = m_pScan_line_0;

		const int half_image_x_size = (m_image_x_size >> 1) - 1;
		const int row_x8 = row * 8;

		for (int x = 0; x < m_image_x_size; x++)
		{
			int y = m_pSample_buf[check_sample_buf_ofs((x >> 4) * BLOCKS_PER_MCU * 64 + ((x & 8) ? 64 : 0) + (x & 7) + row_x8)];

			int c_x0 = (x - 1) >> 1;
			int c_x1 = JPGD_MIN(c_x0 + 1, half_image_x_size);
			c_x0 = JPGD_MAX(c_x0, 0);

			int a = (c_x0 >> 3) * BLOCKS_PER_MCU * 64 + (c_x0 & 7) + row_x8 + 128;
			int cb0 = m_pSample_buf[check_sample_buf_ofs(a)];
			int cr0 = m_pSample_buf[check_sample_buf_ofs(a + 64)];

			int b = (c_x1 >> 3) * BLOCKS_PER_MCU * 64 + (c_x1 & 7) + row_x8 + 128;
			int cb1 = m_pSample_buf[check_sample_buf_ofs(b)];
			int cr1 = m_pSample_buf[check_sample_buf_ofs(b + 64)];

			int w0 = (x & 1) ? 3 : 1;
			int w1 = (x & 1) ? 1 : 3;

			int cb = (cb0 * w0 + cb1 * w1 + 2) >> 2;
			int cr = (cr0 * w0 + cr1 * w1 + 2) >> 2;

			int rc = m_crr[cr];
			int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
			int bc = m_cbb[cb];

			d0[0] = clamp(y + rc);
			d0[1] = clamp(y + gc);
			d0[2] = clamp(y + bc);
			d0[3] = 255;

			d0 += 4;
		}
	}